

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O2

void __thiscall
TEST_TestRegistry_listTestGroupNames_shouldListBackwardsGroup1AfterGroup11AndGroup2OnlyOnce_TestShell
::
~TEST_TestRegistry_listTestGroupNames_shouldListBackwardsGroup1AfterGroup11AndGroup2OnlyOnce_TestShell
          (TEST_TestRegistry_listTestGroupNames_shouldListBackwardsGroup1AfterGroup11AndGroup2OnlyOnce_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestRegistry, listTestGroupNames_shouldListBackwardsGroup1AfterGroup11AndGroup2OnlyOnce)
{
    test1->setGroupName("GROUP_1");
    myRegistry->addTest(test1);
    test2->setGroupName("GROUP_2");
    myRegistry->addTest(test2);
    test3->setGroupName("GROUP_11");
    myRegistry->addTest(test3);
    test4->setGroupName("GROUP_2");
    myRegistry->addTest(test4);

    myRegistry->listTestGroupNames(*result);
    SimpleString s = output->getOutput();
    STRCMP_EQUAL("GROUP_2 GROUP_11 GROUP_1", s.asCharString());
}